

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,SquareMatrix<double> *matrix)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = matrix->size_;
  this->size_ = lVar3;
  if (lVar3 != 0) {
    uVar4 = lVar3 * lVar3;
    lVar3 = 0;
    pdVar2 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar2;
    pdVar1 = (matrix->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
             .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    do {
      pdVar2[lVar3] = pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (uVar4 + (uVar4 == 0) != lVar3);
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
}

Assistant:

inline int64_t size() const { return size_ ; }